

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::HeapType> *
wasm::WATParser::anon_unknown_11::
heaptype<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (Result<wasm::HeapType> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  ParseInput *pPVar2;
  HeapType *u;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Err local_148;
  Err *local_128;
  Err *err;
  undefined1 local_110 [8];
  Result<wasm::HeapType> _val;
  Result<wasm::HeapType> type;
  HeapType local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  HeapType local_90;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  HeapType local_78;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  HeapType local_60;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  HeapType local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  HeapType local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ParseModuleTypesCtx *local_18;
  ParseModuleTypesCtx *ctx_local;
  
  local_18 = ctx;
  ctx_local = (ParseModuleTypesCtx *)__return_storage_ptr__;
  local_28 = sv("func",4);
  bVar1 = ParseInput::takeKeyword(&ctx->in,local_28);
  if (bVar1) {
    local_30.id = (uintptr_t)
                  TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>::
                  makeFunc(&local_18->
                            super_TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                          );
    Result<wasm::HeapType>::Result<wasm::HeapType>(__return_storage_ptr__,&local_30);
  }
  else {
    pPVar2 = &local_18->in;
    local_40 = sv("any",3);
    bVar1 = ParseInput::takeKeyword(pPVar2,local_40);
    if (bVar1) {
      local_48.id = (uintptr_t)
                    TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>::
                    makeAny(&local_18->
                             super_TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                           );
      Result<wasm::HeapType>::Result<wasm::HeapType>(__return_storage_ptr__,&local_48);
    }
    else {
      pPVar2 = &local_18->in;
      local_58 = sv("extern",6);
      bVar1 = ParseInput::takeKeyword(pPVar2,local_58);
      if (bVar1) {
        local_60.id = (uintptr_t)
                      TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>::
                      makeExtern(&local_18->
                                  super_TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                                );
        Result<wasm::HeapType>::Result<wasm::HeapType>(__return_storage_ptr__,&local_60);
      }
      else {
        pPVar2 = &local_18->in;
        local_70 = sv("eq",2);
        bVar1 = ParseInput::takeKeyword(pPVar2,local_70);
        if (bVar1) {
          local_78.id = (uintptr_t)
                        TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>::
                        makeEq(&local_18->
                                super_TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                              );
          Result<wasm::HeapType>::Result<wasm::HeapType>(__return_storage_ptr__,&local_78);
        }
        else {
          pPVar2 = &local_18->in;
          local_88 = sv("i31",3);
          bVar1 = ParseInput::takeKeyword(pPVar2,local_88);
          if (bVar1) {
            local_90.id = (uintptr_t)
                          TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                          ::makeI31(&local_18->
                                     super_TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                                   );
            Result<wasm::HeapType>::Result<wasm::HeapType>(__return_storage_ptr__,&local_90);
          }
          else {
            pPVar2 = &local_18->in;
            local_a0 = sv("struct",6);
            bVar1 = ParseInput::takeKeyword(pPVar2,local_a0);
            if (bVar1) {
              local_a8.id = (uintptr_t)
                            TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                            ::makeStructType(&local_18->
                                              super_TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                                            );
              Result<wasm::HeapType>::Result<wasm::HeapType>(__return_storage_ptr__,&local_a8);
            }
            else {
              pPVar2 = &local_18->in;
              expected = sv("array",5);
              bVar1 = ParseInput::takeKeyword(pPVar2,expected);
              if (bVar1) {
                type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ =
                     TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>::
                     makeArrayType(&local_18->
                                    super_TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                                  );
                Result<wasm::HeapType>::Result<wasm::HeapType>
                          (__return_storage_ptr__,
                           (HeapType *)
                           ((long)&type.val.
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                           0x20));
              }
              else {
                __return_storage_ptr___00 =
                     (__index_type *)
                     ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20);
                typeidx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                          ((Result<wasm::HeapType> *)__return_storage_ptr___00,local_18);
                Result<wasm::HeapType>::Result
                          ((Result<wasm::HeapType> *)local_110,
                           (Result<wasm::HeapType> *)__return_storage_ptr___00);
                local_128 = Result<wasm::HeapType>::getErr((Result<wasm::HeapType> *)local_110);
                bVar1 = local_128 == (Err *)0x0;
                if (!bVar1) {
                  WATParser::Err::Err(&local_148,local_128);
                  Result<wasm::HeapType>::Result(__return_storage_ptr__,&local_148);
                  WATParser::Err::~Err(&local_148);
                }
                Result<wasm::HeapType>::~Result((Result<wasm::HeapType> *)local_110);
                if (bVar1) {
                  u = Result<wasm::HeapType>::operator*
                                ((Result<wasm::HeapType> *)
                                 ((long)&_val.val.
                                         super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                         .
                                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                         .
                                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                 + 0x20));
                  Result<wasm::HeapType>::Result<wasm::HeapType&>(__return_storage_ptr__,u);
                }
                Result<wasm::HeapType>::~Result
                          ((Result<wasm::HeapType> *)
                           ((long)&_val.val.
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                           0x20));
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::HeapTypeT> heaptype(Ctx& ctx) {
  if (ctx.in.takeKeyword("func"sv)) {
    return ctx.makeFunc();
  }
  if (ctx.in.takeKeyword("any"sv)) {
    return ctx.makeAny();
  }
  if (ctx.in.takeKeyword("extern"sv)) {
    return ctx.makeExtern();
  }
  if (ctx.in.takeKeyword("eq"sv)) {
    return ctx.makeEq();
  }
  if (ctx.in.takeKeyword("i31"sv)) {
    return ctx.makeI31();
  }
  if (ctx.in.takeKeyword("struct"sv)) {
    return ctx.makeStructType();
  }
  if (ctx.in.takeKeyword("array"sv)) {
    return ctx.makeArrayType();
  }
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  return *type;
}